

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fiord(mcmcxdef *mctx,voccxdef *vctx,tokcxdef *tctx,char *fname,char *exename,
          fiolcxdef *setupctx,objnum *preinit,uint *flagp,tokpdef *path,uchar **fmtsp,uint *fmtlp,
          uint *pcntptr,int flags,appctxdef *appctx,char *argv0)

{
  char *__src;
  char *in_RCX;
  undefined8 *in_RSI;
  char *in_R8;
  char *in_stack_00000008;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  long in_stack_00000040;
  int resfileno;
  osfildef *fpres;
  char resname [4096];
  char *base_name;
  int i;
  char suffix_uc [4];
  char suffix_lc [4];
  errdef fr_;
  size_t copylen;
  char *display_fname;
  ulong startofs;
  osfildef *fp;
  errdef *in_stack_ffffffffffffed98;
  char *filename;
  errcxdef *in_stack_ffffffffffffeda0;
  FILE *local_11f8;
  char *local_11f0;
  FILE *local_11e0;
  char local_11d8 [24];
  char *in_stack_ffffffffffffee40;
  int in_stack_ffffffffffffee4c;
  appctxdef *in_stack_ffffffffffffee50;
  osfildef *in_stack_ffffffffffffee58;
  errcxdef *in_stack_ffffffffffffee60;
  fiolcxdef *in_stack_fffffffffffff018;
  char *in_stack_fffffffffffff020;
  osfildef *in_stack_fffffffffffff028;
  tokcxdef *in_stack_fffffffffffff030;
  voccxdef *in_stack_fffffffffffff038;
  mcmcxdef *in_stack_fffffffffffff040;
  ulong in_stack_fffffffffffff050;
  objnum *in_stack_fffffffffffff058;
  uint *in_stack_fffffffffffff060;
  tokpdef *in_stack_fffffffffffff068;
  uchar **in_stack_fffffffffffff070;
  uint *in_stack_fffffffffffff078;
  uint *in_stack_fffffffffffff080;
  int in_stack_fffffffffffff088;
  appctxdef *in_stack_fffffffffffff090;
  char *in_stack_fffffffffffff098;
  int local_1c4;
  undefined8 local_1b8;
  int local_1b0;
  __jmp_buf_tag _Stack_148;
  size_t local_80;
  char *local_78;
  char *local_70;
  FILE *local_68;
  char *local_58;
  char *local_50;
  undefined8 *local_40;
  
  in_stack_00000008[0] = -1;
  in_stack_00000008[1] = -1;
  local_11f0 = in_R8;
  if (in_RCX != (char *)0x0) {
    local_11f0 = in_RCX;
  }
  local_78 = local_11f0;
  local_58 = in_R8;
  local_50 = in_RCX;
  local_40 = in_RSI;
  if (local_11f0 == (char *)0x0) {
    G_os_gamename[0] = '\0';
  }
  else {
    local_80 = strlen(local_11f0);
    if (0xfff < local_80) {
      local_80 = 0xfff;
    }
    memcpy(G_os_gamename,local_78,local_80);
    G_os_gamename[local_80] = '\0';
  }
  if (local_50 == (char *)0x0) {
    local_11f8 = (FILE *)os_exeseek(local_58,"TGAM");
  }
  else {
    local_11f8 = fopen(local_50,"rb");
  }
  local_68 = local_11f8;
  if (local_11f8 == (FILE *)0x0) {
    errsigf(in_stack_ffffffffffffeda0,(char *)in_stack_ffffffffffffed98,0);
  }
  if ((in_stack_00000040 != 0) && (*(long *)(in_stack_00000040 + 0x10) != 0)) {
    (**(code **)(in_stack_00000040 + 0x10))(*(undefined8 *)(in_stack_00000040 + 0x18),local_78);
  }
  local_70 = (char *)ftell(local_68);
  local_1b0 = _setjmp(&_Stack_148);
  if (local_1b0 != 0) {
    *(undefined8 *)*local_40 = local_1b8;
    fclose(local_68);
    errrse1(in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
  }
  local_1b8 = *(undefined8 *)*local_40;
  *(undefined8 **)*local_40 = &local_1b8;
  filename = local_70;
  fiord1(in_stack_fffffffffffff040,in_stack_fffffffffffff038,in_stack_fffffffffffff030,
         in_stack_fffffffffffff028,in_stack_fffffffffffff020,in_stack_fffffffffffff018,
         in_stack_fffffffffffff050,in_stack_fffffffffffff058,in_stack_fffffffffffff060,
         in_stack_fffffffffffff068,in_stack_fffffffffffff070,in_stack_fffffffffffff078,
         in_stack_fffffffffffff080,in_stack_fffffffffffff088,in_stack_fffffffffffff090,
         in_stack_fffffffffffff098);
  __src = local_78;
  if ((in_stack_00000040 != 0) && (*(long *)(in_stack_00000040 + 0x80) != 0)) {
    for (local_1c4 = 0; local_1c4 < 9; local_1c4 = local_1c4 + 1) {
      if (*(long *)(in_stack_00000040 + 0xa0) == 0) {
        if (__src == (char *)0x0) {
          local_11d8[0] = '\0';
        }
        else {
          strcpy(local_11d8,__src);
        }
      }
      else {
        os_get_root_name(in_stack_00000008);
        os_build_full_path(in_stack_00000018,in_stack_00000010,in_stack_00000008,filename);
      }
      os_remext(in_stack_00000008);
      os_addext(in_stack_00000008,filename);
      local_11e0 = fopen(local_11d8,"rb");
      if (local_11e0 == (FILE *)0x0) {
        os_remext(in_stack_00000008);
        os_addext(in_stack_00000008,filename);
        local_11e0 = fopen(local_11d8,"rb");
      }
      if (local_11e0 != (FILE *)0x0) {
        (**(code **)(in_stack_00000040 + 0x80))
                  (*(undefined8 *)(in_stack_00000040 + 0x88),local_11d8);
        fiordrscext(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,
                    in_stack_ffffffffffffee4c,in_stack_ffffffffffffee40);
        fclose(local_11e0);
      }
    }
  }
  *(undefined8 *)*local_40 = local_1b8;
  return;
}

Assistant:

void fiord(mcmcxdef *mctx, voccxdef *vctx, tokcxdef *tctx, char *fname,
           char *exename, fiolcxdef *setupctx, objnum *preinit, uint *flagp,
           tokpdef *path, uchar **fmtsp, uint *fmtlp, uint *pcntptr,
           int flags, struct appctxdef *appctx, char *argv0)
{
    osfildef *fp;
    ulong     startofs;
    char     *display_fname;
    
    /* presume there will be no need to run preinit */
    *preinit = MCMONINV;

    /* 
     *   get the display filename - use the real filename if one is
     *   provided, otherwise use the name of the executable file itself 
     */
    display_fname = (fname != 0 ? fname : exename);

    /* save the filename in G_os_gamename */
    if (display_fname != 0)
    {
        size_t copylen;

        /* limit the copy to the buffer size */
        if ((copylen = strlen(display_fname)) > sizeof(G_os_gamename) - 1)
            copylen = sizeof(G_os_gamename) - 1;

        /* save it */
        memcpy(G_os_gamename, display_fname, copylen);
        G_os_gamename[copylen] = '\0';
    }
    else
        G_os_gamename[0] = '\0';
    
    /* open the file and read and check file header */
    fp = (fname != 0 ? osfoprb(fname, OSFTGAME)
                     : os_exeseek(exename, "TGAM"));
    if (fp == 0)
        errsig(vctx->voccxerr, ERR_OPRGAM);

    /* 
     *   we've identified the .GAM file source - tell the host system
     *   about it, if it's interested 
     */
    if (appctx != 0 && appctx->set_game_name != 0)
        (*appctx->set_game_name)(appctx->set_game_name_ctx, display_fname);

    /* remember starting location in file */
    startofs = osfpos(fp);

    ERRBEGIN(vctx->voccxerr)

    /* 
     *   Read the game file.  Note that the .GAM file always has resource
     *   file number zero. 
     */
    fiord1(mctx, vctx, tctx, fp, display_fname,
           setupctx, startofs, preinit, flagp, path,
           fmtsp, fmtlp, pcntptr, flags, appctx, argv0);

    /*
     *   If the host system accepts additional resource files, look for
     *   additional resource files.  These are files in the same directory
     *   as the .GAM file, with the .GAM suffix replaced by suffixes from
     *.  RS0 to .RS9.  
     */
    if (appctx != 0 && appctx->add_resfile != 0)
    {
        char suffix_lc[4];
        char suffix_uc[4];
        int i;
        char *base_name;

        /* use the game or executable filename, as appropriate */
        base_name = display_fname;

        /* build the initial suffixes - try both upper- and lower-case */
        suffix_uc[0] = 'R';
        suffix_uc[1] = 'S';
        suffix_uc[3] = '\0';
        suffix_lc[0] = 'r';
        suffix_lc[1] = 's';
        suffix_lc[3] = '\0';

        /* loop through each possible suffix (.RS0 through .RS9) */
        for (i = 0 ; i < 9 ; ++i)
        {
            char resname[OSFNMAX];
            osfildef *fpres;
            int resfileno;

            /* 
             *   Build the next resource filename.  If there's an explicit
             *   resource path, use it, otherwise use the same directory
             *   that contains the .GAM file. 
             */
            if (appctx->ext_res_path != 0)
            {
                /*
                 *   There's an explicit resource path - append the root
                 *   (filename-only, minus path) portion of the .GAM file
                 *   name to the resource path. 
                 */
                os_build_full_path(resname, sizeof(resname),
                                   appctx->ext_res_path,
                                   os_get_root_name(base_name));
            }
            else
            {
                /* 
                 *   there's no resource path - use the entire .GAM
                 *   filename, including directory, so that we look in the
                 *   same directory that contains the .GAM file 
                 */
                if (base_name != 0)
                    strcpy(resname, base_name);
                else
                    resname[0] = '\0';
            }

            /* add the current extension (replacing any current extension) */
            os_remext(resname);
            suffix_lc[2] = suffix_uc[2] = '0' + i;
            os_addext(resname, suffix_lc);

            /* try opening the file */
            fpres = osfoprb(resname, OSFTGAME);

            /* if that didn't work, try the upper-case name */
            if (fpres == 0)
            {
                /* replace the suffix with the upper-case version */
                os_remext(resname);
                os_addext(resname, suffix_uc);

                /* try again with the new name */
                fpres = osfoprb(resname, OSFTGAME);
            }

            /* if we opened it successfully, read it */
            if (fpres != 0)
            {
                /* tell the host system about it */
                resfileno = (*appctx->add_resfile)
                            (appctx->add_resfile_ctx, resname);

                /* read the file */
                fiordrscext(vctx->voccxerr, fpres, appctx,
                            resfileno, resname);

                /* we're done with the file, so close it */
                osfcls(fpres);
            }
        }
    }

    ERRCLEAN(vctx->voccxerr)
        /* if an error occurs during read, clean up by closing the file */
        osfcls(fp);
    ERRENDCLN(vctx->voccxerr);
}